

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O0

void __thiscall jsonip::writer<false>::new_member(writer<false> *this,char *str)

{
  ostream *poVar1;
  char *str_local;
  writer<false> *this_local;
  
  pre(this);
  poVar1 = std::operator<<(this->os,'\"');
  poVar1 = std::operator<<(poVar1,str);
  poVar1 = std::operator<<(poVar1,'\"');
  std::operator<<(poVar1," : ");
  this->comma = false;
  return;
}

Assistant:

void new_member(const char* str)
        {
            pre();
            // TODO escape
            os << '"' << str << '"' << " : ";
            comma = false;
        }